

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

void google::protobuf::internal::SerializeMapValueRefWithCachedSizes
               (FieldDescriptor *field,MapValueRef *value,CodedOutputStream *output)

{
  bool value_00;
  Type TVar1;
  uint32 uVar2;
  int32 iVar3;
  int value_01;
  uint64 uVar4;
  int64 iVar5;
  string *psVar6;
  MessageLite *pMVar7;
  float value_02;
  double value_03;
  CodedOutputStream *output_local;
  MapValueRef *value_local;
  FieldDescriptor *field_local;
  
  TVar1 = FieldDescriptor::type(field);
  switch(TVar1) {
  case TYPE_DOUBLE:
    value_03 = MapValueRef::GetDoubleValue(value);
    WireFormatLite::WriteDouble(2,value_03,output);
    break;
  case TYPE_FLOAT:
    value_02 = MapValueRef::GetFloatValue(value);
    WireFormatLite::WriteFloat(2,value_02,output);
    break;
  case TYPE_INT64:
    iVar5 = MapValueRef::GetInt64Value(value);
    WireFormatLite::WriteInt64(2,iVar5,output);
    break;
  case TYPE_UINT64:
    uVar4 = MapValueRef::GetUInt64Value(value);
    WireFormatLite::WriteUInt64(2,uVar4,output);
    break;
  case TYPE_INT32:
    iVar3 = MapValueRef::GetInt32Value(value);
    WireFormatLite::WriteInt32(2,iVar3,output);
    break;
  case TYPE_FIXED64:
    uVar4 = MapValueRef::GetUInt64Value(value);
    WireFormatLite::WriteFixed64(2,uVar4,output);
    break;
  case TYPE_FIXED32:
    uVar2 = MapValueRef::GetUInt32Value(value);
    WireFormatLite::WriteFixed32(2,uVar2,output);
    break;
  case TYPE_BOOL:
    value_00 = MapValueRef::GetBoolValue(value);
    WireFormatLite::WriteBool(2,value_00,output);
    break;
  case TYPE_STRING:
    psVar6 = MapValueRef::GetStringValue_abi_cxx11_(value);
    WireFormatLite::WriteString(2,psVar6,output);
    break;
  case TYPE_GROUP:
    pMVar7 = &MapValueRef::GetMessageValue(value)->super_MessageLite;
    WireFormatLite::WriteGroup(2,pMVar7,output);
    break;
  case TYPE_MESSAGE:
    pMVar7 = &MapValueRef::GetMessageValue(value)->super_MessageLite;
    WireFormatLite::WriteMessage(2,pMVar7,output);
    break;
  case TYPE_BYTES:
    psVar6 = MapValueRef::GetStringValue_abi_cxx11_(value);
    WireFormatLite::WriteBytes(2,psVar6,output);
    break;
  case TYPE_UINT32:
    uVar2 = MapValueRef::GetUInt32Value(value);
    WireFormatLite::WriteUInt32(2,uVar2,output);
    break;
  case TYPE_ENUM:
    value_01 = MapValueRef::GetEnumValue(value);
    WireFormatLite::WriteEnum(2,value_01,output);
    break;
  case TYPE_SFIXED32:
    iVar3 = MapValueRef::GetInt32Value(value);
    WireFormatLite::WriteSFixed32(2,iVar3,output);
    break;
  case TYPE_SFIXED64:
    iVar5 = MapValueRef::GetInt64Value(value);
    WireFormatLite::WriteSFixed64(2,iVar5,output);
    break;
  case TYPE_SINT32:
    iVar3 = MapValueRef::GetInt32Value(value);
    WireFormatLite::WriteSInt32(2,iVar3,output);
    break;
  case MAX_TYPE:
    iVar5 = MapValueRef::GetInt64Value(value);
    WireFormatLite::WriteSInt64(2,iVar5,output);
  }
  return;
}

Assistant:

static void SerializeMapValueRefWithCachedSizes(const FieldDescriptor* field,
                                                const MapValueRef& value,
                                                io::CodedOutputStream* output) {
  switch (field->type()) {
#define CASE_TYPE(FieldType, CamelFieldType, CamelCppType)                     \
  case FieldDescriptor::TYPE_##FieldType:                                      \
    WireFormatLite::Write##CamelFieldType(2, value.Get##CamelCppType##Value(), \
                                          output);                             \
    break;
    CASE_TYPE(INT64, Int64, Int64)
    CASE_TYPE(UINT64, UInt64, UInt64)
    CASE_TYPE(INT32, Int32, Int32)
    CASE_TYPE(FIXED64, Fixed64, UInt64)
    CASE_TYPE(FIXED32, Fixed32, UInt32)
    CASE_TYPE(BOOL, Bool, Bool)
    CASE_TYPE(UINT32, UInt32, UInt32)
    CASE_TYPE(SFIXED32, SFixed32, Int32)
    CASE_TYPE(SFIXED64, SFixed64, Int64)
    CASE_TYPE(SINT32, SInt32, Int32)
    CASE_TYPE(SINT64, SInt64, Int64)
    CASE_TYPE(ENUM, Enum, Enum)
    CASE_TYPE(DOUBLE, Double, Double)
    CASE_TYPE(FLOAT, Float, Float)
    CASE_TYPE(STRING, String, String)
    CASE_TYPE(BYTES, Bytes, String)
    CASE_TYPE(MESSAGE, Message, Message)
    CASE_TYPE(GROUP, Group, Message)
#undef CASE_TYPE
  }
}